

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int write_data(spng_ctx *ctx,void *data,size_t bytes)

{
  size_t *psVar1;
  ulong uVar2;
  int iVar3;
  int unaff_EBP;
  
  if ((ctx->field_0xcc & 1) == 0) {
    iVar3 = require_bytes(ctx,bytes);
    if (iVar3 != 0) {
      ctx->state = SPNG_STATE_INVALID;
      return iVar3;
    }
    memcpy(ctx->write_ptr,data,bytes);
    ctx->write_ptr = ctx->write_ptr + bytes;
  }
  else {
    iVar3 = (*(code *)ctx->write_fn)(ctx,ctx->stream_user_ptr,data,bytes);
    if (iVar3 != 0) {
      unaff_EBP = -2;
      if (iVar3 == -1) {
        unaff_EBP = -1;
      }
      ctx->state = SPNG_STATE_INVALID;
    }
    if (iVar3 != 0) {
      return unaff_EBP;
    }
  }
  psVar1 = &ctx->bytes_encoded;
  uVar2 = *psVar1;
  *psVar1 = *psVar1 + bytes;
  return (uint)CARRY8(uVar2,bytes) * 3;
}

Assistant:

static int write_data(spng_ctx *ctx, const void *data, size_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!bytes) return 0;

    if(ctx->streaming)
    {
        if(bytes > SPNG_WRITE_SIZE) return SPNG_EINTERNAL;

        int ret = ctx->write_fn(ctx, ctx->stream_user_ptr, (void*)data, bytes);

        if(ret)
        {
            if(ret > 0 || ret < SPNG_IO_ERROR) ret = SPNG_IO_ERROR;

            return encode_err(ctx, ret);
        }
    }
    else
    {
        int ret = require_bytes(ctx, bytes);
        if(ret) return encode_err(ctx, ret);

        memcpy(ctx->write_ptr, data, bytes);

        ctx->write_ptr += bytes;
    }

    ctx->bytes_encoded += bytes;
    if(ctx->bytes_encoded < bytes) return SPNG_EOVERFLOW;

    return 0;
}